

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

StringView __thiscall anon_unknown.dwarf_1da1d1::Db::parseNumber(Db *this,bool AllowNegative)

{
  char *First_;
  int iVar1;
  size_t sVar2;
  bool bVar3;
  char *Tmp;
  bool AllowNegative_local;
  Db *this_local;
  
  First_ = this->First;
  if (AllowNegative) {
    consumeIf(this,'n');
  }
  sVar2 = numLeft(this);
  if ((sVar2 == 0) || (iVar1 = isdigit((int)*this->First), iVar1 == 0)) {
    StringView::StringView((StringView *)&this_local);
  }
  else {
    while( true ) {
      sVar2 = numLeft(this);
      bVar3 = false;
      if (sVar2 != 0) {
        iVar1 = isdigit((int)*this->First);
        bVar3 = iVar1 != 0;
      }
      if (!bVar3) break;
      this->First = this->First + 1;
    }
    StringView::StringView((StringView *)&this_local,First_,this->First);
  }
  return _this_local;
}

Assistant:

StringView Db::parseNumber(bool AllowNegative) {
  const char *Tmp = First;
  if (AllowNegative)
    consumeIf('n');
  if (numLeft() == 0 || !std::isdigit(*First))
    return StringView();
  while (numLeft() != 0 && std::isdigit(*First))
    ++First;
  return StringView(Tmp, First);
}